

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XInstPrinter.c
# Opt level: O0

char * M680X_insn_name(csh handle,uint id)

{
  uint id_local;
  csh handle_local;
  char (*local_8) [6];
  
  if (id < 0x165) {
    local_8 = s_instruction_names + (int)id;
  }
  else {
    local_8 = (char (*) [6])0x0;
  }
  return *local_8;
}

Assistant:

const char *M680X_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET

	if (id >= ARR_SIZE(s_instruction_names))
		return NULL;
	else
		return s_instruction_names[(int)id];

#else
	return NULL;
#endif
}